

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_point
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,Vec3f *_point
          )

{
  undefined1 local_20 [8];
  VectorT<double,_3> dst;
  
  local_20 = (undefined1  [8])(double)(_point->super_VectorDataT<float,_3>).values_[0];
  dst.super_VectorDataT<double,_3>.values_[0] =
       (double)(_point->super_VectorDataT<float,_3>).values_[1];
  dst.super_VectorDataT<double,_3>.values_[1] =
       (double)(_point->super_VectorDataT<float,_3>).values_[2];
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::set_point
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             this->mesh_,_vh,(Point *)local_20);
  return;
}

Assistant:

virtual void set_point(VertexHandle _vh, const Vec3f& _point)
  {
    mesh_.set_point(_vh,vector_cast<Point>(_point));
  }